

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogFinish(void)

{
  ImGuiLogType IVar1;
  _func_void_void_ptr_char_ptr *p_Var2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  char *pcVar5;
  
  pIVar4 = GImGui;
  if (GImGui->LogEnabled == true) {
    LogText("\n");
    IVar1 = pIVar4->LogType;
    if (IVar1 == ImGuiLogType_Clipboard) {
      if (1 < (pIVar4->LogBuffer).Buf.Size) {
        p_Var2 = (GImGui->IO).SetClipboardTextFn;
        if (p_Var2 != (_func_void_void_ptr_char_ptr *)0x0) {
          pcVar3 = (pIVar4->LogBuffer).Buf.Data;
          pcVar5 = ImGuiTextBuffer::EmptyString;
          if (pcVar3 != (char *)0x0) {
            pcVar5 = pcVar3;
          }
          (*p_Var2)((GImGui->IO).ClipboardUserData,pcVar5);
        }
      }
    }
    else if (IVar1 == ImGuiLogType_File) {
      fclose((FILE *)pIVar4->LogFile);
    }
    else if (IVar1 == ImGuiLogType_TTY) {
      fflush((FILE *)pIVar4->LogFile);
    }
    pIVar4->LogEnabled = false;
    pIVar4->LogType = ImGuiLogType_None;
    pIVar4->LogFile = (ImFileHandle)0x0;
    ImGuiTextBuffer::clear(&pIVar4->LogBuffer);
    return;
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    switch (g.LogType)
    {
    case ImGuiLogType_TTY:
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        fflush(g.LogFile);
#endif
        break;
    case ImGuiLogType_File:
        ImFileClose(g.LogFile);
        break;
    case ImGuiLogType_Buffer:
        break;
    case ImGuiLogType_Clipboard:
        if (!g.LogBuffer.empty())
            SetClipboardText(g.LogBuffer.begin());
        break;
    case ImGuiLogType_None:
        IM_ASSERT(0);
        break;
    }

    g.LogEnabled = false;
    g.LogType = ImGuiLogType_None;
    g.LogFile = NULL;
    g.LogBuffer.clear();
}